

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_DumpGraphIntoFile(Emb_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  __stream = fopen("1.g","w");
  iVar2 = p->nObjData;
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + uVar5);
      uVar4 = puVar1[1];
      if (0 < (int)uVar4 && puVar1[3] == p->nTravIds) {
        lVar3 = 0;
        do {
          if (puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar3 + 5] + 3] != p->nTravIds) {
            __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                          ,0x43c,"void Emb_DumpGraphIntoFile(Emb_Man_t *)");
          }
          fprintf(__stream,"%d %d\n",(ulong)puVar1[4],
                  (ulong)puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar3 + 5] + 4]);
          uVar4 = puVar1[1];
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < (int)uVar4);
        iVar2 = p->nObjData;
      }
      uVar4 = (int)uVar5 + (*puVar1 >> 4) + uVar4 + 5;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < iVar2);
  }
  fclose(__stream);
  return;
}

Assistant:

void Emb_DumpGraphIntoFile( Emb_Man_t * p )
{
    FILE * pFile;
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    pFile = fopen( "1.g", "w" );
    Emb_ManForEachObj( p, pThis, i )
    {
        if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjForEachFanout( pThis, pNext, k )
        {
            assert( Emb_ObjIsTravIdCurrent(p, pNext) );
            fprintf( pFile, "%d %d\n", pThis->Value, pNext->Value );
        }
    }
    fclose( pFile );
}